

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

istream * amrex::operator>>(istream *is,expect *exp)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (uint)(exp->istr)._M_string_length;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar2) {
LAB_003fa034:
      if ((uint)uVar3 != uVar1) {
        std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
        std::operator+(&local_50,"expect fails to find \"",&exp->istr);
        std::operator+(&local_70,&local_50,"\"");
        std::__cxx11::string::~string((string *)&local_50);
        Error_host((char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p)
                  );
        std::__cxx11::string::~string((string *)&local_70);
      }
      return is;
    }
    std::operator>>(is,(char *)&local_70);
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
LAB_003fa031:
      uVar3 = uVar2 & 0xffffffff;
      goto LAB_003fa034;
    }
    if ((char)local_70._M_dataplus._M_p != (exp->istr)._M_dataplus._M_p[uVar2]) {
      std::istream::putback((char)is);
      uVar2 = uVar2 + 1;
      goto LAB_003fa031;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

std::istream&
amrex::operator>>(std::istream& is, const expect& exp)
{
    int len = exp.istr.size();
    int n = 0;
    while ( n < len )
    {
        char c;
        is >> c;
        if ( !is ) break;
        if ( c != exp.istr[n++] )
        {
            is.putback(c);
            break;
        }
    }
    if ( n != len )
    {
        is.clear(std::ios::badbit|is.rdstate());
        std::string msg = "expect fails to find \"" + exp.the_string() + "\"";
        amrex::Error(msg.c_str());
    }
    return is;
}